

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O2

cmCMakePath * __thiscall
cmCMakePath::GetWideExtension(cmCMakePath *__return_storage_ptr__,cmCMakePath *this)

{
  bool bVar1;
  long lVar2;
  string_view source;
  string file;
  path local_38;
  
  std::filesystem::__cxx11::path::filename(&local_38,&this->Path);
  std::filesystem::__cxx11::path::string(&file,&local_38);
  std::filesystem::__cxx11::path::~path(&local_38);
  if (file._M_string_length != 0) {
    bVar1 = std::operator==(&file,".");
    if (!bVar1) {
      bVar1 = std::operator==(&file,"..");
      if (!bVar1) {
        lVar2 = std::__cxx11::string::find((char)&file,0x2e);
        if (lVar2 != -1) {
          source._M_str = file._M_dataplus._M_p + lVar2;
          source._M_len = file._M_string_length - lVar2;
          cmCMakePath(__return_storage_ptr__,source,generic_format);
          goto LAB_0031f7c1;
        }
      }
    }
  }
  (__return_storage_ptr__->Path)._M_pathname.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->Path)._M_pathname.field_2 + 8) = 0;
  (__return_storage_ptr__->Path)._M_pathname._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->Path)._M_pathname._M_string_length = 0;
  (__return_storage_ptr__->Path)._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (_Impl *)0x0;
  std::filesystem::__cxx11::path::path(&__return_storage_ptr__->Path);
LAB_0031f7c1:
  std::__cxx11::string::~string((string *)&file);
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath cmCMakePath::GetWideExtension() const
{
  auto file = this->Path.filename().string();
  if (file.empty() || file == "." || file == "..") {
    return cmCMakePath{};
  }

  auto pos = file.find('.', file[0] == '.' ? 1 : 0);
  if (pos != std::string::npos) {
    return cm::string_view(file.data() + pos, file.length() - pos);
  }

  return cmCMakePath{};
}